

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void * __thiscall jpgd::jpeg_decoder::alloc(jpeg_decoder *this,size_t nSize,bool zero)

{
  mem_block **ppmVar1;
  ulong uVar2;
  mem_block *pmVar3;
  int iVar4;
  ulong __n;
  char *__s;
  
  __n = nSize + 3 + (ulong)(nSize == 0) & 0xfffffffffffffffc;
  ppmVar1 = &this->m_pMem_blocks;
  __s = (char *)0x0;
  pmVar3 = (mem_block *)ppmVar1;
  do {
    pmVar3 = pmVar3->m_pNext;
    if (pmVar3 == (mem_block *)0x0) goto LAB_0014d954;
    uVar2 = pmVar3->m_used_count + __n;
  } while (pmVar3->m_size < uVar2);
  __s = pmVar3->m_data + pmVar3->m_used_count;
  pmVar3->m_used_count = uVar2;
LAB_0014d954:
  if (__s == (char *)0x0) {
    uVar2 = __n + 0x7ff & 0xfffffffffffff800;
    iVar4 = 0x7f00;
    if (0x7f00 < uVar2) {
      iVar4 = (int)uVar2;
    }
    pmVar3 = (mem_block *)malloc((long)iVar4 + 0x20);
    if (pmVar3 == (mem_block *)0x0) {
      stop_decoding(this,JPGD_NOTENOUGHMEM);
    }
    pmVar3->m_pNext = *ppmVar1;
    *ppmVar1 = pmVar3;
    pmVar3->m_used_count = __n;
    pmVar3->m_size = (long)iVar4;
    __s = pmVar3->m_data;
  }
  if (zero) {
    memset(__s,0,__n);
  }
  return __s;
}

Assistant:

void* jpeg_decoder::alloc(size_t nSize, bool zero)
	{
		nSize = (JPGD_MAX(nSize, 1) + 3) & ~3;
		char* rv = nullptr;
		for (mem_block* b = m_pMem_blocks; b; b = b->m_pNext)
		{
			if ((b->m_used_count + nSize) <= b->m_size)
			{
				rv = b->m_data + b->m_used_count;
				b->m_used_count += nSize;
				break;
			}
		}
		if (!rv)
		{
			int capacity = JPGD_MAX(32768 - 256, (nSize + 2047) & ~2047);
			mem_block* b = (mem_block*)jpgd_malloc(sizeof(mem_block) + capacity);
			if (!b)
			{
				stop_decoding(JPGD_NOTENOUGHMEM);
			}

			b->m_pNext = m_pMem_blocks;
			m_pMem_blocks = b;
			b->m_used_count = nSize;
			b->m_size = capacity;
			rv = b->m_data;
		}
		if (zero) memset(rv, 0, nSize);
		return rv;
	}